

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
genRandom(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int num_samples,
         int num_dimensions)

{
  bool bVar1;
  size_t __n;
  reference pdVar2;
  result_type_conflict rVar3;
  double *v;
  iterator __end1;
  iterator __begin1;
  vector<double,_std::allocator<double>_> *__range1;
  uniform_real_distribution<double> unif;
  allocator<double> local_1a;
  undefined1 local_19;
  int local_18;
  int local_14;
  int num_dimensions_local;
  int num_samples_local;
  vector<double,_std::allocator<double>_> *x;
  
  local_19 = 0;
  local_18 = num_dimensions;
  local_14 = num_samples;
  _num_dimensions_local = __return_storage_ptr__;
  __n = TasGrid::Utils::size_mult<int,int>(num_samples,num_dimensions);
  std::allocator<double>::allocator(&local_1a);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__n,&local_1a);
  std::allocator<double>::~allocator(&local_1a);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)&__range1,-1.0,1.0);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  v = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&v), bVar1) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)&__range1,&park_miller);
    *pdVar2 = rVar3;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> genRandom(int num_samples, int num_dimensions = 1){
    std::vector<double> x(Utils::size_mult(num_samples, num_dimensions));
    std::uniform_real_distribution<double> unif(-1.0, 1.0);
    for(auto &v : x) v = unif(park_miller);
    return x;
}